

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  ZSTD_format_e ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params in_stack_fffffffffffffe58;
  ZSTD_parameters local_d0;
  undefined8 local_a8 [4];
  ZSTD_frameParameters ZStack_88;
  undefined4 local_7c;
  uint local_78;
  undefined1 local_74 [68];
  
  bVar6 = 0;
  sVar2 = dictSize;
  if (dict == (void *)0x0) {
    sVar2 = 0;
  }
  ZSTD_getParams(&local_d0,compressionLevel,srcSize + (srcSize == 0),sVar2);
  ZVar1 = (cctx->requestedParams).format;
  memcpy(local_74,&(cctx->requestedParams).forceWindow,0x44);
  local_a8[0] = CONCAT44(local_d0.cParams.windowLog,ZVar1);
  local_a8[1]._0_4_ = local_d0.cParams.chainLog;
  local_a8[1]._4_4_ = local_d0.cParams.hashLog;
  local_a8[2]._0_4_ = local_d0.cParams.searchLog;
  local_a8[2]._4_4_ = local_d0.cParams.searchLength;
  ZStack_88.noDictIDFlag = local_d0.fParams.noDictIDFlag;
  local_a8[3]._0_4_ = local_d0.cParams.targetLength;
  local_a8[3]._4_4_ = local_d0.cParams.strategy;
  ZStack_88.contentSizeFlag = local_d0.fParams.contentSizeFlag;
  ZStack_88.checksumFlag = local_d0.fParams.checksumFlag;
  local_7c = 3;
  local_78 = (uint)compressionLevel >> 0x1f;
  puVar4 = local_a8;
  puVar5 = (undefined8 *)&stack0xfffffffffffffe58;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     in_stack_fffffffffffffe58,srcSize,ZSTDb_not_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    sVar2 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
    return sVar2;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize,
                               const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, srcSize ? srcSize : 1, dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    assert(params.fParams.contentSizeFlag == 1);
    ZSTD_CCtxParam_setParameter(&cctxParams, ZSTD_p_compressLiterals, compressionLevel>=0);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, cctxParams);
}